

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O0

void * unpack_new(t_symbol *s,int argc,t_atom *argv)

{
  char cVar1;
  t_gstub *ptVar2;
  _outlet *p_Var3;
  int iStack_5c;
  char c;
  t_atomtype type;
  int i;
  t_unpackout *u;
  t_atom *ap;
  t_atom defarg [2];
  t_unpack *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  defarg[1].a_w.w_symbol = (t_symbol *)pd_new(unpack_class);
  x = (t_unpack *)argv;
  argv_local._4_4_ = argc;
  if (argc == 0) {
    x = (t_unpack *)&ap;
    argv_local._4_4_ = 2;
    ap._0_4_ = 1;
    defarg[0].a_type = A_NULL;
    defarg[0].a_w.w_float = 1.4013e-45;
    defarg[1].a_type = A_NULL;
  }
  ((defarg[1].a_w.w_array)->a_gp).gp_stub = (t_gstub *)(long)argv_local._4_4_;
  ptVar2 = (t_gstub *)getbytes((long)argv_local._4_4_ << 4);
  (defarg[1].a_w.w_array)->a_stub = ptVar2;
  iStack_5c = 0;
  u = (t_unpackout *)x;
  _type = (defarg[1].a_w.w_array)->a_stub;
  for (; iStack_5c < argv_local._4_4_; iStack_5c = iStack_5c + 1) {
    if (u->u_type == A_SYMBOL) {
      cVar1 = *(char *)&(u->u_outlet->o_owner->te_g).g_pd;
      if (cVar1 == 's') {
        *(undefined4 *)&_type->gs_un = 2;
        p_Var3 = outlet_new((t_object *)defarg[1].a_w.w_symbol,&s_symbol);
        *(_outlet **)&_type->gs_which = p_Var3;
      }
      else if (cVar1 == 'p') {
        *(undefined4 *)&_type->gs_un = 3;
        p_Var3 = outlet_new((t_object *)defarg[1].a_w.w_symbol,&s_pointer);
        *(_outlet **)&_type->gs_which = p_Var3;
      }
      else {
        if (cVar1 != 'f') {
          pd_error(defarg[1].a_w.w_symbol,"unpack: %s: bad type",u->u_outlet->o_owner);
        }
        *(undefined4 *)&_type->gs_un = 1;
        p_Var3 = outlet_new((t_object *)defarg[1].a_w.w_symbol,&s_float);
        *(_outlet **)&_type->gs_which = p_Var3;
      }
    }
    else {
      *(undefined4 *)&_type->gs_un = 1;
      p_Var3 = outlet_new((t_object *)defarg[1].a_w.w_symbol,&s_float);
      *(_outlet **)&_type->gs_which = p_Var3;
    }
    _type = _type + 1;
    u = u + 1;
  }
  return defarg[1].a_w.w_symbol;
}

Assistant:

static void *unpack_new(t_symbol *s, int argc, t_atom *argv)
{
    t_unpack *x = (t_unpack *)pd_new(unpack_class);
    t_atom defarg[2], *ap;
    t_unpackout *u;
    int i;
    if (!argc)
    {
        argv = defarg;
        argc = 2;
        SETFLOAT(&defarg[0], 0);
        SETFLOAT(&defarg[1], 0);
    }
    x->x_n = argc;
    x->x_vec = (t_unpackout *)getbytes(argc * sizeof(*x->x_vec));
    for (i = 0, ap = argv, u = x->x_vec; i < argc; u++, ap++, i++)
    {
        t_atomtype type = ap->a_type;
        if (type == A_SYMBOL)
        {
            char c = *ap->a_w.w_symbol->s_name;
            if (c == 's')
            {
                u->u_type = A_SYMBOL;
                u->u_outlet = outlet_new(&x->x_obj, &s_symbol);
            }
            else if (c == 'p')
            {
                u->u_type =  A_POINTER;
                u->u_outlet = outlet_new(&x->x_obj, &s_pointer);
            }
            else
            {
                if (c != 'f') pd_error(x, "unpack: %s: bad type",
                    ap->a_w.w_symbol->s_name);
                u->u_type = A_FLOAT;
                u->u_outlet = outlet_new(&x->x_obj, &s_float);
            }
        }
        else
        {
            u->u_type =  A_FLOAT;
            u->u_outlet = outlet_new(&x->x_obj, &s_float);
        }
    }
    return (x);
}